

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O1

void PrintHeader(int globalstrategy,int maxl,int maxlrst,sunrealtype fnormtol,sunrealtype scsteptol,
                int linsolver)

{
  char *pcVar1;
  
  puts("\nPredator-prey test problem --  KINSol (serial version)\n");
  printf("Mesh dimensions = %d X %d\n",5,5);
  printf("Number of species = %d\n",6);
  printf("Total system size = %d\n\n",0x96);
  printf("Flag globalstrategy = %d (0 = None, 1 = Linesearch)\n",0);
  switch(maxl) {
  case 0:
    pcVar1 = "Linear solver is SPGMR with maxl = %d, maxlrst = %d\n";
    break;
  case 1:
    pcVar1 = "Linear solver is SPBCGS with maxl = %d\n";
    goto LAB_0010328d;
  case 2:
    pcVar1 = "Linear solver is SPTFQMR with maxl = %d\n";
LAB_0010328d:
    printf(pcVar1,globalstrategy);
    goto switchD_0010325b_default;
  case 3:
    pcVar1 = "Linear solver is SPFGMR with maxl = %d, maxlrst = %d\n";
    break;
  default:
    goto switchD_0010325b_default;
  }
  printf(pcVar1,globalstrategy,2);
switchD_0010325b_default:
  puts("Preconditioning uses interaction-only block-diagonal matrix");
  puts("Positivity constraints imposed on all components ");
  printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n",0x3e7ad7f29abcaf48,
         0x3d3c25c268497682);
  puts("\nInitial profile of concentration");
  printf("At all mesh points:  %g %g %g   %g %g %g\n",0x3ff0000000000000,0x3ff0000000000000,0,
         0x40dd4c0000000000,0,0);
  return;
}

Assistant:

static void PrintHeader(int globalstrategy, int maxl, int maxlrst,
                        sunrealtype fnormtol, sunrealtype scsteptol,
                        int linsolver)
{
  printf("\nPredator-prey test problem --  KINSol (serial version)\n\n");
  printf("Mesh dimensions = %d X %d\n", MX, MY);
  printf("Number of species = %d\n", NUM_SPECIES);
  printf("Total system size = %d\n\n", NEQ);
  printf("Flag globalstrategy = %d (0 = None, 1 = Linesearch)\n", globalstrategy);

  switch (linsolver)
  {
  case (USE_SPGMR):
    printf("Linear solver is SPGMR with maxl = %d, maxlrst = %d\n", maxl,
           maxlrst);
    break;

  case (USE_SPBCGS):
    printf("Linear solver is SPBCGS with maxl = %d\n", maxl);
    break;

  case (USE_SPTFQMR):
    printf("Linear solver is SPTFQMR with maxl = %d\n", maxl);
    break;

  case (USE_SPFGMR):
    printf("Linear solver is SPFGMR with maxl = %d, maxlrst = %d\n", maxl,
           maxlrst);
    break;
  }

  printf("Preconditioning uses interaction-only block-diagonal matrix\n");
  printf("Positivity constraints imposed on all components \n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerance parameters:  fnormtol = %Lg   scsteptol = %Lg\n", fnormtol,
         scsteptol);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n", fnormtol,
         scsteptol);
#else
  printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n", fnormtol,
         scsteptol);
#endif

  printf("\nInitial profile of concentration\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("At all mesh points:  %Lg %Lg %Lg   %Lg %Lg %Lg\n", PREYIN, PREYIN,
         PREYIN, PREDIN, PREDIN, PREDIN);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("At all mesh points:  %g %g %g   %g %g %g\n", PREYIN, PREYIN, PREYIN,
         PREDIN, PREDIN, PREDIN);
#else
  printf("At all mesh points:  %g %g %g   %g %g %g\n", PREYIN, PREYIN, PREYIN,
         PREDIN, PREDIN, PREDIN);
#endif
}